

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.cpp
# Opt level: O3

int main(void)

{
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Debugging is OFF",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
  std::ostream::put(-0x10);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Test #, Message, Total Time in msec, # of objects, team per object, objects per second"
             ,0x56);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
  std::ostream::put(-0x10);
  std::ostream::flush();
  start_timing();
  Am_Initialize();
  Am_Update_All();
  end_timing("Initialize",0);
  time_object_creation();
  time_data_structures();
  Am_Update_All();
  start_timing();
  Am_Cleanup();
  end_timing("Cleanup",0);
  print_summary();
  return 0;
}

Assistant:

int
main()
{
#if defined DEBUG | defined _DEBUG
  std::cout << "Debugging is ON" << std::endl;
#else
  std::cout << "Debugging is OFF" << std::endl;
#endif

  std::cout << "Test #, Message, Total Time in msec, # of objects, team per "
               "object, objects per second"
            << std::endl;

  start_timing();
  Am_Initialize();
  Am_Update_All();
  end_timing("Initialize", 0);

  time_object_creation();

  time_data_structures();

  Am_Update_All();
  start_timing();
  Am_Cleanup();
  end_timing("Cleanup", 0);
  print_summary();

  return 0;
}